

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::LowerScopedLdFld
          (Lowerer *this,Instr *ldFldInstr,JnHelperMethod helperMethod,bool withInlineCache)

{
  LowererMD *this_00;
  code *pcVar1;
  bool bVar2;
  JITTimeFunctionBody *this_01;
  intptr_t address;
  AddrOpnd *opndArg;
  Instr *pIVar3;
  Opnd *pOVar4;
  SymOpnd *pSVar5;
  undefined4 *puVar6;
  PropertySymOpnd *pPVar7;
  IntConstOpnd *opndArg_00;
  undefined7 in_register_00000009;
  Lowerer *this_02;
  
  if ((int)CONCAT71(in_register_00000009,withInlineCache) == 0) {
    LoadScriptContext(this,ldFldInstr);
  }
  this_01 = Func::GetJITFunctionBody(this->m_func);
  address = JITTimeFunctionBody::GetRootObject(this_01);
  opndArg = IR::AddrOpnd::New(address,AddrOpndKindDynamicVar,this->m_func,true,(Var)0x0);
  this_00 = &this->m_lowererMD;
  pIVar3 = LowererMD::LoadHelperArgument(this_00,ldFldInstr,&opndArg->super_Opnd);
  pOVar4 = IR::Instr::UnlinkSrc1(ldFldInstr);
  bVar2 = IR::Opnd::IsSymOpnd(pOVar4);
  if (bVar2) {
    pSVar5 = IR::Opnd::AsSymOpnd(pOVar4);
    if (pSVar5->m_sym->m_kind != SymKindProperty) goto LAB_00546e06;
  }
  else {
LAB_00546e06:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x1af2,"(src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym())",
                       "Expected property sym as src");
    if (!bVar2) goto LAB_00546f66;
    *puVar6 = 0;
  }
  LoadPropertySymAsArgument(this,ldFldInstr,pOVar4);
  if (withInlineCache) {
    pSVar5 = IR::Opnd::AsSymOpnd(pOVar4);
    bVar2 = IR::SymOpnd::IsPropertySymOpnd(pSVar5);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1af7,"(src->AsSymOpnd()->IsPropertySymOpnd())",
                         "Need property sym operand to find the inline cache");
      if (!bVar2) {
LAB_00546f66:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    pPVar7 = IR::Opnd::AsPropertySymOpnd(pOVar4);
    opndArg_00 = IR::Opnd::CreateInlineCacheIndexOpnd(pPVar7->m_inlineCacheIndex,this->m_func);
    LowererMD::LoadHelperArgument(this_00,ldFldInstr,&opndArg_00->super_Opnd);
    pPVar7 = IR::Opnd::AsPropertySymOpnd(pOVar4);
    pOVar4 = LoadRuntimeInlineCacheOpnd(this,ldFldInstr,pPVar7,false);
    this_02 = (Lowerer *)this_00;
    LowererMD::LoadHelperArgument(this_00,ldFldInstr,pOVar4);
    pOVar4 = LoadFunctionBodyOpnd(this_02,ldFldInstr);
    LowererMD::LoadHelperArgument(this_00,ldFldInstr,pOVar4);
  }
  LowererMD::ChangeToHelperCall
            (this_00,ldFldInstr,helperMethod,(LabelInstr *)0x0,(Opnd *)0x0,(PropertySymOpnd *)0x0,
             false);
  return pIVar3;
}

Assistant:

IR::Instr *
Lowerer::LowerScopedLdFld(IR::Instr * ldFldInstr, IR::JnHelperMethod helperMethod, bool withInlineCache)
{
    IR::Opnd *src;
    IR::Instr *instrPrev = ldFldInstr->m_prev;

    if(!withInlineCache)
    {
        LoadScriptContext(ldFldInstr);
    }

    intptr_t rootObject = m_func->GetJITFunctionBody()->GetRootObject();
    src = IR::AddrOpnd::New(rootObject, IR::AddrOpndKindDynamicVar, this->m_func, true);
    instrPrev = m_lowererMD.LoadHelperArgument(ldFldInstr, src);

    src = ldFldInstr->UnlinkSrc1();
    AssertMsg(src->IsSymOpnd() && src->AsSymOpnd()->m_sym->IsPropertySym(), "Expected property sym as src");
    this->LoadPropertySymAsArgument(ldFldInstr, src);

    if (withInlineCache)
    {
        AssertMsg(src->AsSymOpnd()->IsPropertySymOpnd(), "Need property sym operand to find the inline cache");

        m_lowererMD.LoadHelperArgument(
            ldFldInstr,
            IR::Opnd::CreateInlineCacheIndexOpnd(src->AsPropertySymOpnd()->m_inlineCacheIndex, m_func));

        // Not using the polymorphic inline cache because the fast path only uses the monomorphic inline cache
        this->m_lowererMD.LoadHelperArgument(ldFldInstr, this->LoadRuntimeInlineCacheOpnd(ldFldInstr, src->AsPropertySymOpnd()));

        m_lowererMD.LoadHelperArgument(ldFldInstr, LoadFunctionBodyOpnd(ldFldInstr));
    }
    m_lowererMD.ChangeToHelperCall(ldFldInstr, helperMethod);

    return instrPrev;
}